

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall
wabt::OptionParser::Option::Option
          (Option *this,char short_name,string *long_name,string *metavar,HasArgument has_argument,
          string *help,Callback *callback)

{
  pointer pcVar1;
  
  this->short_name = short_name;
  (this->long_name)._M_dataplus._M_p = (pointer)&(this->long_name).field_2;
  pcVar1 = (long_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->long_name,pcVar1,pcVar1 + long_name->_M_string_length);
  (this->metavar)._M_dataplus._M_p = (pointer)&(this->metavar).field_2;
  pcVar1 = (metavar->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->metavar,pcVar1,pcVar1 + metavar->_M_string_length);
  this->has_argument = has_argument == Yes;
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  pcVar1 = (help->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->help,pcVar1,pcVar1 + help->_M_string_length);
  std::function<void_(const_char_*)>::function(&this->callback,callback);
  return;
}

Assistant:

OptionParser::Option::Option(char short_name,
                             const std::string& long_name,
                             const std::string& metavar,
                             HasArgument has_argument,
                             const std::string& help,
                             const Callback& callback)
    : short_name(short_name),
      long_name(long_name),
      metavar(metavar),
      has_argument(has_argument == HasArgument::Yes),
      help(help),
      callback(callback) {}